

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O2

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,UnaryOperatorExpression *expression)

{
  ostream *poVar1;
  OperatorChar OVar2;
  Expression *pEVar3;
  OperatorChar local_44;
  string local_40;
  
  poVar1 = this->mStream;
  OVar2 = UnaryOperatorExpression::op(expression);
  local_44._0_2_ = OVar2._0_2_;
  local_44.mOp2 = OVar2.mOp2;
  OperatorChar::toString_abi_cxx11_(&local_40,&local_44);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pEVar3 = UnaryOperatorExpression::operand(expression);
  (*pEVar3->_vptr_Expression[2])(pEVar3,this,expression);
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, UnaryOperatorExpression* expression) {
	mStream << expression->op().toString();
	expression->operand()->accept(*this, expression);
}